

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O1

void nn_btcp_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_usock *self_00;
  nn_ctx **self_01;
  int iVar1;
  int iVar2;
  ulong extraout_RAX;
  nn_list_item *pnVar3;
  nn_list_item *pnVar4;
  nn_fsm *pnVar5;
  char *pcVar6;
  size_t sVar7;
  nn_atcp *pnVar8;
  uint *self_02;
  int extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  int extraout_EDX_02;
  uint uVar9;
  nn_btcp *self_03;
  nn_fsm *self_04;
  int iStack_10c;
  size_t sStack_108;
  size_t sStack_100;
  sockaddr_storage sStack_f8;
  nn_fsm *pnStack_70;
  ulong uStack_68;
  
  self_02 = &switchD_0012c27b::switchdataD_001353f8;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) goto LAB_0012c2a4;
      nn_btcp_handler_cold_11();
      type = extraout_EDX;
      goto switchD_0012c27b_caseD_9;
    }
LAB_0012c3d1:
    nn_btcp_handler_cold_10();
    break;
  case 2:
    pnVar5 = self[8].owner;
    if (pnVar5 == (nn_fsm *)srcptr) {
      if (type == 0x85b7) {
        pnVar3 = nn_list_end((nn_list *)&self[8].ctx);
        nn_list_insert((nn_list *)&self[8].ctx,(nn_list_item *)&pnVar5[0x14].stopped.item,pnVar3);
        self[8].owner = (nn_fsm *)0x0;
        nn_btcp_start_accepting((nn_btcp *)self);
        return;
      }
      goto LAB_0012c3f4;
    }
    if (src != 2) {
      nn_btcp_handler_cold_7();
      goto LAB_0012c3b6;
    }
    if (type == 0x85b9) {
      nn_list_erase((nn_list *)&self[8].ctx,(nn_list_item *)((long)srcptr + 0x730));
      nn_atcp_term((nn_atcp *)srcptr);
      nn_free(srcptr);
      return;
    }
    uVar9 = 2;
    if (type == 0x85b8) {
      nn_atcp_stop((nn_atcp *)srcptr);
      return;
    }
    goto LAB_0012c3fd;
  default:
    goto switchD_0012c27b_caseD_3;
  case 7:
    if (src != 3) goto LAB_0012c3bf;
    if (type == 1) {
      nn_backoff_stop((nn_backoff *)&self[8].stopped.src);
      *(undefined4 *)&self[1].fn = 9;
      return;
    }
    goto LAB_0012c3e1;
  case 8:
    if (src != 1) goto LAB_0012c3c8;
    if (type == 8) {
      return;
    }
    if (type == 7) {
      nn_backoff_start((nn_backoff *)&self[8].stopped.src);
      *(undefined4 *)&self[1].fn = 7;
      return;
    }
    goto LAB_0012c3ed;
  case 9:
switchD_0012c27b_caseD_9:
    if (src != 3) {
LAB_0012c3b6:
      nn_btcp_handler_cold_1();
LAB_0012c3bf:
      nn_btcp_handler_cold_3();
LAB_0012c3c8:
      nn_btcp_handler_cold_5();
      goto LAB_0012c3d1;
    }
    if (type == 2) {
LAB_0012c2a4:
      nn_btcp_start_listening((nn_btcp *)self);
      return;
    }
  }
  nn_btcp_handler_cold_2();
LAB_0012c3e1:
  nn_btcp_handler_cold_4();
switchD_0012c27b_caseD_3:
  nn_btcp_handler_cold_12();
LAB_0012c3ed:
  nn_btcp_handler_cold_6();
  type = extraout_EDX_00;
LAB_0012c3f4:
  uVar9 = type;
  nn_btcp_handler_cold_9();
  type = extraout_EDX_01;
LAB_0012c3fd:
  pnVar5 = (nn_fsm *)(ulong)uVar9;
  nn_btcp_handler_cold_8();
  if (extraout_EDX_02 == -3 && type == 0xfffffffe) goto LAB_0012c44c;
  while( true ) {
    if ((*(int *)&pnVar5[1].fn == 3) && (nn_btcp_shutdown_cold_2(), (extraout_RAX & 1) != 0)) {
      return;
    }
    uVar9 = *(uint *)&pnVar5[1].fn;
    self_03 = (nn_btcp *)(ulong)uVar9;
    if (uVar9 == 4) {
      iVar1 = nn_usock_isidle((nn_usock *)&pnVar5[1].srcptr);
      if (iVar1 == 0) {
        return;
      }
      iVar1 = nn_backoff_isidle((nn_backoff *)&pnVar5[8].stopped.src);
      if (iVar1 == 0) {
        return;
      }
      self_01 = &pnVar5[8].ctx;
      for (pnVar3 = nn_list_begin((nn_list *)self_01); pnVar4 = nn_list_end((nn_list *)self_01),
          pnVar3 != pnVar4; pnVar3 = nn_list_next((nn_list *)self_01,pnVar3)) {
        pnVar8 = (nn_atcp *)(pnVar3 + -0x73);
        if (pnVar3 == (nn_list_item *)0x0) {
          pnVar8 = (nn_atcp *)0x0;
        }
        nn_atcp_stop(pnVar8);
      }
      *(undefined4 *)&pnVar5[1].fn = 5;
      goto LAB_0012c509;
    }
    if (uVar9 == 5) break;
    nn_btcp_shutdown_cold_4();
LAB_0012c44c:
    nn_btcp_shutdown_cold_1();
  }
  if ((type == 2) && (extraout_EDX_02 == 0x85b9)) {
    nn_list_erase((nn_list *)&pnVar5[8].ctx,&((nn_atcp *)self_02)->item);
    nn_atcp_term((nn_atcp *)self_02);
    nn_free(self_02);
LAB_0012c509:
    iVar1 = nn_list_empty((nn_list *)&pnVar5[8].ctx);
    if (iVar1 == 0) {
      return;
    }
    *(undefined4 *)&pnVar5[1].fn = 1;
    nn_fsm_stopped_noevent(pnVar5);
    nn_epbase_stopped((nn_epbase *)&pnVar5[1].shutdown_fn);
    return;
  }
  nn_btcp_shutdown_cold_3();
  pnStack_70 = pnVar5;
  uStack_68 = (ulong)(uint)type;
  pnVar5 = (nn_fsm *)nn_epbase_getaddr(&self_03->epbase);
  sStack_f8.ss_family = 0;
  sStack_f8.__ss_padding[0] = '\0';
  sStack_f8.__ss_padding[1] = '\0';
  sStack_f8.__ss_padding[2] = '\0';
  sStack_f8.__ss_padding[3] = '\0';
  sStack_f8.__ss_padding[4] = '\0';
  sStack_f8.__ss_padding[5] = '\0';
  sStack_f8.__ss_padding[6] = '\0';
  sStack_f8.__ss_padding[7] = '\0';
  sStack_f8.__ss_padding[8] = '\0';
  sStack_f8.__ss_padding[9] = '\0';
  sStack_f8.__ss_padding[10] = '\0';
  sStack_f8.__ss_padding[0xb] = '\0';
  sStack_f8.__ss_padding[0xc] = '\0';
  sStack_f8.__ss_padding[0xd] = '\0';
  sStack_f8.__ss_padding[0xe] = '\0';
  sStack_f8.__ss_padding[0xf] = '\0';
  sStack_f8.__ss_padding[0x10] = '\0';
  sStack_f8.__ss_padding[0x11] = '\0';
  sStack_f8.__ss_padding[0x12] = '\0';
  sStack_f8.__ss_padding[0x13] = '\0';
  sStack_f8.__ss_padding[0x14] = '\0';
  sStack_f8.__ss_padding[0x15] = '\0';
  sStack_f8.__ss_padding[0x16] = '\0';
  sStack_f8.__ss_padding[0x17] = '\0';
  sStack_f8.__ss_padding[0x18] = '\0';
  sStack_f8.__ss_padding[0x19] = '\0';
  sStack_f8.__ss_padding[0x1a] = '\0';
  sStack_f8.__ss_padding[0x1b] = '\0';
  sStack_f8.__ss_padding[0x1c] = '\0';
  sStack_f8.__ss_padding[0x1d] = '\0';
  sStack_f8.__ss_padding[0x1e] = '\0';
  sStack_f8.__ss_padding[0x1f] = '\0';
  sStack_f8.__ss_padding[0x20] = '\0';
  sStack_f8.__ss_padding[0x21] = '\0';
  sStack_f8.__ss_padding[0x22] = '\0';
  sStack_f8.__ss_padding[0x23] = '\0';
  sStack_f8.__ss_padding[0x24] = '\0';
  sStack_f8.__ss_padding[0x25] = '\0';
  sStack_f8.__ss_padding[0x26] = '\0';
  sStack_f8.__ss_padding[0x27] = '\0';
  sStack_f8.__ss_padding[0x28] = '\0';
  sStack_f8.__ss_padding[0x29] = '\0';
  sStack_f8.__ss_padding[0x2a] = '\0';
  sStack_f8.__ss_padding[0x2b] = '\0';
  sStack_f8.__ss_padding[0x2c] = '\0';
  sStack_f8.__ss_padding[0x2d] = '\0';
  sStack_f8.__ss_padding[0x2e] = '\0';
  sStack_f8.__ss_padding[0x2f] = '\0';
  sStack_f8.__ss_padding[0x30] = '\0';
  sStack_f8.__ss_padding[0x31] = '\0';
  sStack_f8.__ss_padding[0x32] = '\0';
  sStack_f8.__ss_padding[0x33] = '\0';
  sStack_f8.__ss_padding[0x34] = '\0';
  sStack_f8.__ss_padding[0x35] = '\0';
  sStack_f8.__ss_padding[0x36] = '\0';
  sStack_f8.__ss_padding[0x37] = '\0';
  sStack_f8.__ss_padding[0x38] = '\0';
  sStack_f8.__ss_padding[0x39] = '\0';
  sStack_f8.__ss_padding[0x3a] = '\0';
  sStack_f8.__ss_padding[0x3b] = '\0';
  sStack_f8.__ss_padding[0x3c] = '\0';
  sStack_f8.__ss_padding[0x3d] = '\0';
  sStack_f8.__ss_padding[0x3e] = '\0';
  sStack_f8.__ss_padding[0x3f] = '\0';
  sStack_f8.__ss_padding[0x40] = '\0';
  sStack_f8.__ss_padding[0x41] = '\0';
  sStack_f8.__ss_padding[0x42] = '\0';
  sStack_f8.__ss_padding[0x43] = '\0';
  sStack_f8.__ss_padding[0x44] = '\0';
  sStack_f8.__ss_padding[0x45] = '\0';
  sStack_f8.__ss_padding[0x46] = '\0';
  sStack_f8.__ss_padding[0x47] = '\0';
  sStack_f8.__ss_padding[0x48] = '\0';
  sStack_f8.__ss_padding[0x49] = '\0';
  sStack_f8.__ss_padding[0x4a] = '\0';
  sStack_f8.__ss_padding[0x4b] = '\0';
  sStack_f8.__ss_padding[0x4c] = '\0';
  sStack_f8.__ss_padding[0x4d] = '\0';
  sStack_f8.__ss_padding[0x4e] = '\0';
  sStack_f8.__ss_padding[0x4f] = '\0';
  sStack_f8.__ss_padding[0x50] = '\0';
  sStack_f8.__ss_padding[0x51] = '\0';
  sStack_f8.__ss_padding[0x52] = '\0';
  sStack_f8.__ss_padding[0x53] = '\0';
  sStack_f8.__ss_padding[0x54] = '\0';
  sStack_f8.__ss_padding[0x55] = '\0';
  sStack_f8.__ss_padding[0x56] = '\0';
  sStack_f8.__ss_padding[0x57] = '\0';
  sStack_f8.__ss_padding[0x58] = '\0';
  sStack_f8.__ss_padding[0x59] = '\0';
  sStack_f8.__ss_padding[0x5a] = '\0';
  sStack_f8.__ss_padding[0x5b] = '\0';
  sStack_f8.__ss_padding[0x5c] = '\0';
  sStack_f8.__ss_padding[0x5d] = '\0';
  sStack_f8.__ss_padding[0x5e] = '\0';
  sStack_f8.__ss_padding[0x5f] = '\0';
  sStack_f8.__ss_padding[0x60] = '\0';
  sStack_f8.__ss_padding[0x61] = '\0';
  sStack_f8.__ss_padding[0x62] = '\0';
  sStack_f8.__ss_padding[99] = '\0';
  sStack_f8.__ss_padding[100] = '\0';
  sStack_f8.__ss_padding[0x65] = '\0';
  sStack_f8.__ss_padding[0x66] = '\0';
  sStack_f8.__ss_padding[0x67] = '\0';
  sStack_f8.__ss_padding[0x68] = '\0';
  sStack_f8.__ss_padding[0x69] = '\0';
  sStack_f8.__ss_padding[0x6a] = '\0';
  sStack_f8.__ss_padding[0x6b] = '\0';
  sStack_f8.__ss_padding[0x6c] = '\0';
  sStack_f8.__ss_padding[0x6d] = '\0';
  sStack_f8.__ss_padding[0x6e] = '\0';
  sStack_f8.__ss_padding[0x6f] = '\0';
  sStack_f8.__ss_padding[0x70] = '\0';
  sStack_f8.__ss_padding[0x71] = '\0';
  sStack_f8.__ss_padding[0x72] = '\0';
  sStack_f8.__ss_padding[0x73] = '\0';
  sStack_f8.__ss_padding[0x74] = '\0';
  sStack_f8.__ss_padding[0x75] = '\0';
  sStack_f8.__ss_align = 0;
  pcVar6 = strrchr((char *)pnVar5,0x3a);
  if (pcVar6 == (char *)0x0) {
    nn_btcp_start_listening_cold_5();
LAB_0012c6d4:
    nn_btcp_start_listening_cold_4();
LAB_0012c6d9:
    nn_btcp_start_listening_cold_1();
  }
  else {
    sVar7 = strlen((char *)pnVar5);
    pcVar6 = pcVar6 + 1;
    iVar1 = nn_port_resolve(pcVar6,(size_t)((long)pnVar5 + (sVar7 - (long)pcVar6)));
    if (iVar1 < 0) goto LAB_0012c6d4;
    sStack_100 = 4;
    nn_epbase_getopt(&self_03->epbase,0,0xe,&iStack_10c,&sStack_100);
    if (sStack_100 != 4) goto LAB_0012c6d9;
    iVar2 = nn_iface_resolve((char *)pnVar5,(size_t)(pcVar6 + ~(ulong)pnVar5),iStack_10c,&sStack_f8,
                             &sStack_108);
    if (iVar2 == 0) {
      sStack_108 = 0x10;
      if (sStack_f8.ss_family != 2) {
        if (sStack_f8.ss_family != 10) {
          nn_btcp_start_listening_cold_3();
          if (pnVar5[8].owner == (nn_fsm *)0x0) {
            self_04 = (nn_fsm *)0x740;
            pnVar8 = (nn_atcp *)nn_alloc_(0x740);
            pnVar5[8].owner = (nn_fsm *)pnVar8;
            if (pnVar8 != (nn_atcp *)0x0) {
              nn_atcp_init(pnVar8,2,(nn_epbase *)&pnVar5[1].shutdown_fn,pnVar5);
              nn_atcp_start((nn_atcp *)pnVar5[8].owner,(nn_usock *)&pnVar5[1].srcptr);
              return;
            }
          }
          else {
            nn_btcp_start_accepting_cold_1();
            self_04 = pnVar5;
          }
          nn_btcp_start_accepting_cold_2();
          if (self_04 != (nn_fsm *)0x0) {
            self_04 = (nn_fsm *)&self_04[-2].stopped.item;
          }
          nn_fsm_stop(self_04);
          return;
        }
        sStack_108 = 0x1c;
      }
      sStack_f8.__ss_padding._0_2_ = (ushort)iVar1 << 8 | (ushort)iVar1 >> 8;
      self_00 = &self_03->usock;
      iVar1 = nn_usock_start(self_00,(uint)sStack_f8.ss_family,1,0);
      if (-1 < iVar1) {
        iVar1 = nn_usock_bind(self_00,(sockaddr *)&sStack_f8,sStack_108);
        if ((-1 < iVar1) && (iVar1 = nn_usock_listen(self_00,100), -1 < iVar1)) {
          nn_btcp_start_accepting(self_03);
          self_03->state = 2;
          return;
        }
        nn_usock_stop(self_00);
        self_03->state = 8;
        return;
      }
      goto LAB_0012c6e5;
    }
  }
  nn_btcp_start_listening_cold_2();
LAB_0012c6e5:
  nn_backoff_start(&self_03->retry);
  self_03->state = 7;
  return;
}

Assistant:

static void nn_btcp_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_btcp *btcp;
    struct nn_atcp *atcp;

    btcp = nn_cont (self, struct nn_btcp, fsm);

    switch (btcp->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BTCP_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_btcp_start_listening (btcp);
                return;
            default:
                nn_fsm_bad_action (btcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (btcp->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  The execution is yielded to the atcp state machine in this state.         */
/******************************************************************************/
    case NN_BTCP_STATE_ACTIVE:
        if (srcptr == btcp->atcp) {
            switch (type) {
            case NN_ATCP_ACCEPTED:

                /*  Move the newly created connection to the list of existing
                    connections. */
                nn_list_insert (&btcp->atcps, &btcp->atcp->item,
                    nn_list_end (&btcp->atcps));
                btcp->atcp = NULL;

                /*  Start waiting for a new incoming connection. */
                nn_btcp_start_accepting (btcp);

                return;

            default:
                nn_fsm_bad_action (btcp->state, src, type);
            }
        }

        /*  For all remaining events we'll assume they are coming from one
            of remaining child atcp objects. */
        nn_assert (src == NN_BTCP_SRC_ATCP);
        atcp = (struct nn_atcp*) srcptr;
        switch (type) {
        case NN_ATCP_ERROR:
            nn_atcp_stop (atcp);
            return;
        case NN_ATCP_STOPPED:
            nn_list_erase (&btcp->atcps, &atcp->item);
            nn_atcp_term (atcp);
            nn_free (atcp);
            return;
        default:
            nn_fsm_bad_action (btcp->state, src, type);
        }

/******************************************************************************/
/*  CLOSING_USOCK state.                                                     */
/*  usock object was asked to stop but it haven't stopped yet.                */
/******************************************************************************/
    case NN_BTCP_STATE_CLOSING:
        switch (src) {

        case NN_BTCP_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_backoff_start (&btcp->retry);
                btcp->state = NN_BTCP_STATE_WAITING;
                return;
            default:
                nn_fsm_bad_action (btcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (btcp->state, src, type);
        }

/******************************************************************************/
/*  WAITING state.                                                            */
/*  Waiting before re-bind is attempted. This way we won't overload           */
/*  the system by continuous re-bind attemps.                                 */
/******************************************************************************/
    case NN_BTCP_STATE_WAITING:
        switch (src) {

        case NN_BTCP_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_TIMEOUT:
                nn_backoff_stop (&btcp->retry);
                btcp->state = NN_BTCP_STATE_STOPPING_BACKOFF;
                return;
            default:
                nn_fsm_bad_action (btcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (btcp->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_BACKOFF state.                                                   */
/*  backoff object was asked to stop, but it haven't stopped yet.             */
/******************************************************************************/
    case NN_BTCP_STATE_STOPPING_BACKOFF:
        switch (src) {

        case NN_BTCP_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_STOPPED:
                nn_btcp_start_listening (btcp);
                return;
            default:
                nn_fsm_bad_action (btcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (btcp->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (btcp->state, src, type);
    }
}